

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STPathSet.h
# Opt level: O1

bool __thiscall jbcoin::STPathElement::operator==(STPathElement *this,STPathElement *t)

{
  long lVar1;
  
  if ((((t->mType ^ this->mType) & 1) == 0) && (this->hash_value_ == t->hash_value_)) {
    lVar1 = 0;
    do {
      if (*(char *)((long)(this->mAccountID).pn + lVar1) !=
          *(char *)((long)(t->mAccountID).pn + lVar1)) goto LAB_001ee894;
      lVar1 = lVar1 + 1;
    } while (lVar1 != 0x14);
    lVar1 = 0x14;
LAB_001ee894:
    if (lVar1 == 0x14) {
      lVar1 = 0;
      do {
        if (*(char *)((long)(this->mCurrencyID).pn + lVar1) !=
            *(char *)((long)(t->mCurrencyID).pn + lVar1)) goto LAB_001ee8b4;
        lVar1 = lVar1 + 1;
      } while (lVar1 != 0x14);
      lVar1 = 0x14;
LAB_001ee8b4:
      if (lVar1 == 0x14) {
        lVar1 = 0;
        do {
          if (*(char *)((long)(this->mIssuerID).pn + lVar1) !=
              *(char *)((long)(t->mIssuerID).pn + lVar1)) goto LAB_001ee8d4;
          lVar1 = lVar1 + 1;
        } while (lVar1 != 0x14);
        lVar1 = 0x14;
LAB_001ee8d4:
        return lVar1 == 0x14;
      }
    }
  }
  return false;
}

Assistant:

bool
    operator== (const STPathElement& t) const
    {
        return (mType & typeAccount) == (t.mType & typeAccount) &&
            hash_value_ == t.hash_value_ &&
            mAccountID == t.mAccountID &&
            mCurrencyID == t.mCurrencyID &&
            mIssuerID == t.mIssuerID;
    }